

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked-list.cpp
# Opt level: O2

void __thiscall LinkedList::insert(LinkedList *this,Node **head,int newNumber,int beforeNumber)

{
  Node *pNVar1;
  ostream *poVar2;
  Node *pNVar3;
  
  pNVar3 = *head;
  if (pNVar3 == (Node *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Empty Linked List");
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  do {
    if (pNVar3 == (Node *)0x0) {
      return;
    }
    if (pNVar3->data == beforeNumber) {
      pNVar1 = (Node *)operator_new(0x10);
      *(undefined8 *)pNVar1 = 0;
      pNVar1->next = (Node *)0x0;
      pNVar1->data = newNumber;
      pNVar1->next = pNVar3->next;
      pNVar3->next = pNVar1;
      if (beforeNumber != newNumber) goto LAB_00101857;
    }
    else {
LAB_00101857:
      pNVar1 = pNVar3;
    }
    pNVar3 = pNVar1->next;
  } while( true );
}

Assistant:

void LinkedList::insert(Node** head, int newNumber, int beforeNumber) {
	Node* last = *head;

	if (last == nullptr) {
		std::cout << "Empty Linked List" << std::endl;
		return;
	}

	while (true) {
		if (last == nullptr) {
			break;
		}
		
		if (last->data == beforeNumber) {
			Node* newNode = new Node();
			newNode->data = newNumber;

			if (last->next == nullptr) {
				newNode->next = nullptr;
			} else {
				newNode->next = last->next;
			}

			last->next = newNode;

			if (beforeNumber == newNumber) {
				last = last->next->next;
				continue;
			}
		}
		
		last = last->next;
	}
}